

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

Abc_Cex_t * Gia_ManAreDeriveCex(Gia_ManAre_t *p,Gia_StaAre_t *pLast)

{
  int nFrames;
  void **ppvVar1;
  Gia_StaAre_t *pCur;
  int iVar2;
  Vec_Ptr_t *p_00;
  Gia_StaAre_t *pGVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (p->iOutFail < 0) {
    __assert_fail("p->iOutFail >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x785,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  Gia_ManAreDeriveCexSatStart(p);
  p_00 = Vec_PtrAlloc(1000);
  for (pGVar3 = pLast; (Gia_StaAre_t *)*p->ppStas != pGVar3; pGVar3 = Gia_StaPrev(p,pGVar3)) {
    if (pGVar3 != pLast) {
      Vec_PtrPush(p_00,pGVar3);
    }
  }
  nFrames = p_00->nSize;
  if (0 < (long)nFrames) {
    iVar7 = p->pAig->nRegs;
    pAVar4 = Abc_CexAlloc(iVar7,p->pAig->vCis->nSize - iVar7,nFrames);
    pAVar4->iFrame = nFrames + -1;
    pAVar4->iPo = p->iOutFail;
    ppvVar1 = p_00->pArray;
    lVar8 = 0;
    pGVar3 = (Gia_StaAre_t *)0x0;
    do {
      if (lVar8 == nFrames) {
        Vec_PtrFree(p_00);
        Gia_ManAreDeriveCexSatStop(p);
        return pAVar4;
      }
      iVar7 = -1;
      if (lVar8 == 0) {
        iVar7 = p->iOutFail;
      }
      pCur = (Gia_StaAre_t *)ppvVar1[lVar8];
      Gia_ManAreDeriveCexSat(p,pCur,pGVar3,iVar7);
      for (iVar7 = 0; iVar7 < p->vCofVars->nSize; iVar7 = iVar7 + 1) {
        iVar2 = Vec_IntEntry(p->vCofVars,iVar7);
        iVar5 = p->pAig->nRegs;
        iVar6 = p->pAig->vCis->nSize - iVar5;
        if (iVar6 <= iVar2) {
          __assert_fail("Var < Gia_ManPiNum(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                        ,0x79a,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
        }
        iVar5 = iVar5 + iVar2 + iVar6 * (~(uint)lVar8 + nFrames);
        (&pAVar4[1].iPo)[iVar5 >> 5] = (&pAVar4[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
      lVar8 = lVar8 + 1;
      pGVar3 = pCur;
    } while( true );
  }
  __assert_fail("Vec_PtrSize(vStates) >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                ,0x78c,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
}

Assistant:

Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast )
{
    Abc_Cex_t * pCex;
    Vec_Ptr_t * vStates;
    Gia_StaAre_t * pSta, * pPrev;
    int Var, i, v;
    assert( p->iOutFail >= 0 );
    Gia_ManAreDeriveCexSatStart( p );
    // compute the trace
    vStates = Vec_PtrAlloc( 1000 );
    for ( pSta = pLast; Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        if ( pSta != pLast )
            Vec_PtrPush( vStates, pSta );
    assert( Vec_PtrSize(vStates) >= 1 );
    // start the counter-example
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pAig), Gia_ManPiNum(p->pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = p->iOutFail;
    // compute states
    pPrev = NULL;
    Vec_PtrForEachEntry( Gia_StaAre_t *, vStates, pSta, i )
    {
        Gia_ManAreDeriveCexSat( p, pSta, pPrev, (i == 0) ? p->iOutFail : -1 ); 
        pPrev = pSta;
        // create the counter-example
        Vec_IntForEachEntry( p->vCofVars, Var, v )
        {
            assert( Var < Gia_ManPiNum(p->pAig) );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pAig) + (Vec_PtrSize(vStates)-1-i) * Gia_ManPiNum(p->pAig) + Var );
        }
    }
    // free temporary things
    Vec_PtrFree( vStates );
    Gia_ManAreDeriveCexSatStop( p );
    return pCex;
}